

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O2

void __thiscall InterpreterThunkEmitter::Close(InterpreterThunkEmitter *this)

{
  SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar3;
  Type pSVar4;
  Type pSVar5;
  
  pSVar1 = &this->thunkBlocks;
  SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount>::
  Iterate<InterpreterThunkEmitter::Close()::__0>
            ((SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount> *)pSVar1);
  pSVar2 = &this->freeListedThunkBlocks;
  SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount>::
  Iterate<InterpreterThunkEmitter::Close()::__0>
            ((SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount> *)pSVar2);
  pAVar3 = &this->allocator->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  pSVar5 = (this->thunkBlocks).super_SListNodeBase<Memory::ArenaAllocator>.next;
  while ((SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *)pSVar5 != pSVar1) {
    pSVar4 = pSVar5->next;
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (pAVar3,pSVar5,0x28);
    pSVar5 = pSVar4;
  }
  (this->thunkBlocks).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &pSVar1->super_SListNodeBase<Memory::ArenaAllocator>;
  (this->thunkBlocks).super_RealCount.count = 0;
  pAVar3 = &this->allocator->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  pSVar5 = (this->freeListedThunkBlocks).super_SListNodeBase<Memory::ArenaAllocator>.next;
  while ((SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *)pSVar5 != pSVar2) {
    pSVar4 = pSVar5->next;
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (pAVar3,pSVar5,0x28);
    pSVar5 = pSVar4;
  }
  (this->freeListedThunkBlocks).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &pSVar2->super_SListNodeBase<Memory::ArenaAllocator>;
  (this->freeListedThunkBlocks).super_RealCount.count = 0;
  EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
  ::Decommit(&this->emitBufferManager);
  this->thunkBuffer = (BYTE *)0x0;
  this->thunkCount = 0;
  return;
}

Assistant:

void InterpreterThunkEmitter::Close()
{
#if PDATA_ENABLED
    auto unregisterPdata = ([&] (const ThunkBlock& block)
    {
        PDataManager::UnregisterPdata((PRUNTIME_FUNCTION) block.GetPdata());
    });
    thunkBlocks.Iterate(unregisterPdata);
    freeListedThunkBlocks.Iterate(unregisterPdata);
#endif

    this->thunkBlocks.Clear(allocator);
    this->freeListedThunkBlocks.Clear(allocator);

#ifdef ENABLE_OOP_NATIVE_CODEGEN
    if (JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        PSCRIPTCONTEXT_HANDLE remoteScript = this->scriptContext->GetRemoteScriptAddr(false);
        if (remoteScript && JITManager::GetJITManager()->IsConnected())
        {
            JITManager::GetJITManager()->DecommitInterpreterBufferManager(remoteScript, this->isAsmInterpreterThunk);
        }
    }
    else
#endif
    {
        emitBufferManager.Decommit();
    }


    this->thunkBuffer = nullptr;
    this->thunkCount = 0;
}